

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapScriptFunctionInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  JavascriptLibrary *this;
  ScriptContext *pSVar1;
  SnapScriptFunctionInfo *pSVar2;
  FunctionBody *proxy;
  ScriptFunction *pSVar3;
  ScriptFunctionWithInlineCache *this_00;
  
  pSVar1 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  pSVar2 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapScriptFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)4>
                     (snpObject);
  proxy = InflateMap::LookupFunctionBody(inflator,pSVar2->BodyRefId);
  this = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  if ((proxy->field_0x17a & 8) == 0) {
    pSVar3 = Js::JavascriptLibrary::CreateScriptFunction(this,(FunctionProxy *)proxy);
    return (RecyclableObject *)pSVar3;
  }
  this_00 = Js::JavascriptLibrary::CreateScriptFunctionWithInlineCache(this,(FunctionProxy *)proxy);
  Js::ScriptFunctionWithInlineCache::CreateInlineCache(this_00);
  return (RecyclableObject *)this_00;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapScriptFunctionInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            SnapScriptFunctionInfo* snapFuncInfo = SnapObjectGetAddtlInfoAs<SnapScriptFunctionInfo*, SnapObjectType::SnapScriptFunctionObject>(snpObject);

            Js::FunctionBody* fbody = inflator->LookupFunctionBody(snapFuncInfo->BodyRefId);

            Js::ScriptFunction* func = nullptr;
            if(!fbody->GetInlineCachesOnFunctionObject())
            {
                func = ctx->GetLibrary()->CreateScriptFunction(fbody);
            }
            else
            {
                Js::ScriptFunctionWithInlineCache* ifunc = ctx->GetLibrary()->CreateScriptFunctionWithInlineCache(fbody);
                ifunc->CreateInlineCache();

                func = ifunc;
            }

            return func;
        }